

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1890:38),_void>
 __thiscall
kj::
RetryOnDisconnect_<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1890:38)>
::apply(RetryOnDisconnect_<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1890:38)>
        *this,Type *func)

{
  Type *pTVar1;
  Type local_20;
  Type *local_18;
  Type *func_local;
  
  local_18 = func;
  func_local = (Type *)this;
  pTVar1 = mv<kj::(anonymous_namespace)::TestCase1884::run()::__0>(func);
  local_20.func.i = (Type)pTVar1->i;
  evalLater<kj::RetryOnDisconnect_<kj::(anonymous_namespace)::TestCase1884::run()::__0>::apply(kj::(anonymous_namespace)::TestCase1884::run()::__0&&)::_lambda()_1_>
            ((kj *)this,&local_20);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

static inline PromiseForResult<Func, void> apply(Func&& func) {
    return evalLater([func = kj::mv(func)]() mutable -> PromiseForResult<Func, void> {
      auto promise = evalNow(func);
      return promise.catch_([func = kj::mv(func)](kj::Exception&& e) mutable -> PromiseForResult<Func, void> {
        if (e.getType() == kj::Exception::Type::DISCONNECTED) {
          return func();
        } else {
          return kj::mv(e);
        }
      });
    });
  }